

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O2

int getVertexCopy(Vertex *vertex,btAlignedObjectArray<btConvexHullInternal::Vertex_*> *vertices)

{
  int iVar1;
  Vertex *local_10;
  
  iVar1 = vertex->copy;
  if (iVar1 < 0) {
    iVar1 = vertices->m_size;
    vertex->copy = iVar1;
    local_10 = vertex;
    btAlignedObjectArray<btConvexHullInternal::Vertex_*>::push_back(vertices,&local_10);
  }
  return iVar1;
}

Assistant:

static int getVertexCopy(btConvexHullInternal::Vertex* vertex, btAlignedObjectArray<btConvexHullInternal::Vertex*>& vertices)
{
	int index = vertex->copy;
	if (index < 0)
	{
		index = vertices.size();
		vertex->copy = index;
		vertices.push_back(vertex);
#ifdef DEBUG_CONVEX_HULL
		printf("Vertex %d gets index *%d\n", vertex->point.index, index);
#endif
	}
	return index;
}